

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O3

void anon_unknown.dwarf_b38c8::testRSMatrix(M44f *M,V3f *t,V3f *r,V3f *s)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  M44f local_68;
  
  fVar10 = t->y * 0.0;
  fVar1 = t->x * 0.0;
  fVar5 = t->z * 0.0;
  fVar2 = fVar1 + fVar10;
  local_68.x[3][0] = fVar5 + t->x + fVar10 + 0.0;
  local_68.x[3][1] = fVar5 + t->y + fVar1 + 0.0;
  local_68.x[3][2] = t->z + fVar2 + 0.0;
  local_68.x[3][3] = fVar2 + fVar5 + 1.0;
  fVar1 = cosf(r->z);
  fVar2 = cosf(r->y);
  fVar5 = cosf(r->x);
  fVar10 = sinf(r->z);
  fVar3 = sinf(r->y);
  fVar4 = sinf(r->x);
  fVar6 = fVar1 * fVar3 * fVar4 - fVar10 * fVar5;
  fVar15 = fVar1 * fVar5 + fVar10 * fVar3 * fVar4;
  fVar22 = fVar10 * fVar4 + fVar5 * fVar1 * fVar3;
  fVar11 = fVar5 * fVar10 * fVar3 - fVar1 * fVar4;
  fVar21 = fVar2 * fVar10 * 0.0;
  fVar12 = fVar1 * fVar2 * 0.0;
  fVar18 = fVar3 * 0.0;
  fVar13 = fVar12 + fVar21;
  fVar14 = fVar15 * 0.0;
  fVar7 = fVar6 * 0.0;
  fVar16 = fVar2 * fVar4 * 0.0;
  fVar8 = fVar7 + fVar14;
  fVar9 = fVar11 * 0.0;
  fVar19 = fVar22 * 0.0;
  fVar17 = fVar2 * fVar5 * 0.0;
  fVar20 = fVar19 + fVar9;
  local_68.x[0][3] = s->x;
  local_68.x[0][0] = local_68.x[0][3] * ((fVar1 * fVar2 + fVar21) - fVar18);
  local_68.x[0][1] = local_68.x[0][3] * ((fVar2 * fVar10 + fVar12) - fVar18);
  local_68.x[0][2] = local_68.x[0][3] * (fVar13 - fVar3);
  local_68.x[0][3] = local_68.x[0][3] * (fVar13 - fVar18);
  local_68.x[1][3] = s->y;
  local_68.x[1][0] = local_68.x[1][3] * (fVar16 + fVar6 + fVar14);
  local_68.x[1][1] = local_68.x[1][3] * (fVar16 + fVar15 + fVar7);
  local_68.x[1][2] = local_68.x[1][3] * (fVar2 * fVar4 + fVar8);
  local_68.x[1][3] = local_68.x[1][3] * (fVar8 + fVar16);
  local_68.x[2][3] = s->z;
  local_68.x[2][0] = local_68.x[2][3] * (fVar17 + fVar22 + fVar9);
  local_68.x[2][1] = local_68.x[2][3] * (fVar17 + fVar11 + fVar19);
  local_68.x[2][2] = local_68.x[2][3] * (fVar2 * fVar5 + fVar20);
  local_68.x[2][3] = local_68.x[2][3] * (fVar20 + fVar17);
  compareMat(M,&local_68);
  return;
}

Assistant:

void
testRSMatrix (M44f& M, V3f& t, V3f& r, V3f& s)
{
    M44f N;
    N.makeIdentity ();
    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.scale (s);

    compareMat (M, N);
}